

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_s2c_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,
              secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *msg32,uchar *seckey,uchar *s2c_data32)

{
  int iVar1;
  undefined1 local_120 [8];
  secp256k1_sha256 s2c_sha;
  uchar ndata [32];
  undefined1 local_88 [4];
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  uchar *s2c_data32_local;
  uchar *seckey_local;
  uchar *msg32_local;
  secp256k1_ecdsa_s2c_opening *s2c_opening_local;
  secp256k1_ecdsa_signature *signature_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"signature != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (s2c_data32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"s2c_data32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_s2c_ecdsa_data_sha256_tagged((secp256k1_sha256 *)local_120);
    secp256k1_sha256_write((secp256k1_sha256 *)local_120,s2c_data32,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_120,(uchar *)&s2c_sha.bytes);
    secp256k1_s2c_ecdsa_point_sha256_tagged((secp256k1_sha256 *)local_120);
    ctx_local._4_4_ =
         secp256k1_ecdsa_sign_inner
                   (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_88,(int *)0x0,
                    (secp256k1_sha256 *)local_120,s2c_opening,s2c_data32,msg32,seckey,
                    (secp256k1_nonce_function)0x0,&s2c_sha.bytes);
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)(s.d + 3),&secp256k1_scalar_zero,
               (uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)local_88,&secp256k1_scalar_zero,
               (uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_ecdsa_signature_save
              (signature,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_88);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_s2c_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature* signature, secp256k1_ecdsa_s2c_opening* s2c_opening, const unsigned char
 *msg32, const unsigned char *seckey, const unsigned char* s2c_data32) {
    secp256k1_scalar r, s;
    int ret;
    unsigned char ndata[32];
    secp256k1_sha256 s2c_sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(s2c_data32 != NULL);

    /* Provide `s2c_data32` to the nonce function as additional data to
     * derive the nonce. It is first hashed because it should be possible
     * to derive nonces even if only a SHA256 commitment to the data is
     * known.  This is important in the ECDSA anti-exfil protocol. */
    secp256k1_s2c_ecdsa_data_sha256_tagged(&s2c_sha);
    secp256k1_sha256_write(&s2c_sha, s2c_data32, 32);
    secp256k1_sha256_finalize(&s2c_sha, ndata);

    secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, &s2c_sha, s2c_opening, s2c_data32, msg32, seckey, NULL, ndata);
    secp256k1_scalar_cmov(&r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_zero, !ret);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}